

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void point_mul_g(uchar *outx,uchar *outy,uchar *scalar)

{
  pt_aff_t_conflict4 P;
  uchar *in_stack_000002f8;
  pt_aff_t_conflict4 *in_stack_00000300;
  uint64_t *in_stack_00000448;
  uint8_t *in_stack_00000450;
  
  fixed_smul_cmb(in_stack_00000300,in_stack_000002f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(in_stack_00000450,in_stack_00000448);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(in_stack_00000450,in_stack_00000448);
  return;
}

Assistant:

static void point_mul_g(unsigned char outx[64], unsigned char outy[64],
                        const unsigned char scalar[64]) {
    pt_aff_t P;

    /* fixed scmul function */
    fixed_smul_cmb(&P, scalar);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(P.X, P.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(P.Y, P.Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(outx, P.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(outy, P.Y);
}